

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::putDown(Projection *this,
                   Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
                   FArrayBox *phi_fine_strip,int c_lev,int f_lev,Orientation *outFaces,
                   int numOutFlowFaces,int ncStripWidth)

{
  IndexType IVar1;
  int iVar2;
  pointer pIVar3;
  undefined8 uVar4;
  pointer pGVar5;
  FabArray<amrex::FArrayBox> *this_00;
  uint uVar6;
  uint uVar7;
  undefined **ppuVar8;
  Box *pBVar9;
  int i;
  uint uVar10;
  Periodicity *period;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  BATType BVar14;
  double *pdVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  Box result;
  Box bx;
  MFIter mfi;
  DistributionMapping dm;
  BoxArray ba;
  MultiFab phi_crse_strip;
  int local_3dc;
  int local_3d8 [4];
  Array4<double> local_3c8;
  ulong local_380;
  long local_378;
  int local_370;
  Box local_36c;
  FArrayBox *local_350;
  ulong local_348;
  long local_340;
  double *local_338;
  long local_330;
  _func_int **local_328;
  IndexType local_320;
  BATindexType local_31c;
  int local_318 [2];
  IndexType local_310;
  undefined1 local_308 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  int local_2e0;
  Vector<int,_std::allocator<int>_> *local_2d0;
  long local_2a0;
  Projection *local_298;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_290;
  Orientation *local_288;
  Box *local_280;
  long local_278;
  IntVect *local_270;
  long local_268;
  Box *local_260;
  long local_258;
  long local_250;
  long local_248;
  double *local_240;
  long local_238;
  long local_230;
  DistributionMapping local_228;
  BoxArray local_218;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_288 = outFaces;
  local_350 = phi_fine_strip;
  local_290 = phi;
  local_298 = this;
  if (c_lev < f_lev) {
    iVar16 = 1;
    local_3dc = 1;
    local_380 = 1;
    local_370 = ncStripWidth + -1;
    local_2a0 = (long)c_lev;
    lVar11 = (long)f_lev;
    do {
      lVar24 = lVar11 + -1;
      pIVar3 = (local_298->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)pIVar3[lVar24].vect;
      local_3dc = (int)uVar4 * local_3dc;
      uVar20 = (int)((ulong)uVar4 >> 0x20) * (int)local_380;
      iVar16 = iVar16 * *(int *)((long)(pIVar3 + lVar24) + 8);
      local_380 = (ulong)uVar20;
      local_3d8[1] = uVar20;
      local_3d8[0] = local_3dc;
      local_3d8[2] = iVar16;
      if (0 < numOutFlowFaces) {
        pGVar5 = (local_298->parent->super_AmrCore).super_AmrMesh.geom.
                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_270 = (IntVect *)((long)(pGVar5 + lVar11 + 0xffffffffffffffff) + 0xb8);
        local_340 = (long)(int)uVar20 << 3;
        local_348 = 0;
        local_278 = lVar24;
        local_280 = (Box *)((long)(pGVar5 + lVar11 + 0xffffffffffffffff) + 0xac);
        do {
          pBVar9 = local_280;
          uVar10 = local_288[local_348].val % 3;
          local_218.m_bat.m_op.m_bndryReg.m_typ.itype =
               (IndexType)(IndexType)*(int *)((long)&local_280->smallend + 8);
          local_218.m_bat._0_8_ = *(_func_int ***)&local_280->smallend;
          local_308._8_4_ = *(int *)((long)local_270->vect + 8);
          local_308._0_8_ =
               (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               *(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                local_270->vect;
          if (local_288[local_348].val < 3) {
            lVar11 = (long)(int)uVar10;
            BVar14 = (&local_218.m_bat.m_bat_type)[lVar11];
            *(BATType *)(local_308 + lVar11 * 4) = BVar14;
            (&local_218.m_bat.m_bat_type)[lVar11] = (BVar14 - ncStripWidth) + indexType;
          }
          else {
            IVar1.itype = (local_280->btype).itype;
            local_3c8.p = (double *)(CONCAT44(IVar1.itype >> 1,IVar1.itype) & 0x100000001);
            local_3c8.jstride._0_4_ = IVar1.itype >> 2 & 1;
            uVar12 = (ulong)uVar10;
            BVar14 = (~*(uint *)((long)&local_3c8.p + uVar12 * 4) & 1) +
                     *(int *)(local_308 + uVar12 * 4);
            (&local_218.m_bat.m_bat_type)[uVar12] = BVar14;
            *(BATType *)(local_308 + uVar12 * 4) = BVar14 + local_370;
          }
          local_310.itype = (pBVar9->btype).itype | 1 << (uVar10 & 0x1f);
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_bat_type =
               (BATType)local_218.m_bat.m_op.m_bndryReg.m_typ.itype;
          local_1b0.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)local_218.m_bat._0_8_;
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
               local_308._8_4_;
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
               SUB84(local_308._0_8_,0);
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
               SUB84(local_308._0_8_,4);
          local_328 = (_func_int **)local_218.m_bat._0_8_;
          local_320.itype = (uint)local_218.m_bat.m_op.m_bndryReg.m_typ.itype;
          local_31c.m_typ.itype =
               (IndexType)
               (IndexType)local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype;
          local_318[0] = local_1b0.super_FabArrayBase.boxarray.m_bat.m_op._4_4_;
          local_318[1] = local_308._8_4_;
          lVar11 = 0;
          do {
            if ((local_310.itype >> ((uint)lVar11 & 0x1f) & 1) == 0) {
              (&local_31c)[lVar11].m_typ.itype = (&local_31c)[lVar11].m_typ.itype + 1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          local_310.itype = 7;
          amrex::BoxArray::BoxArray(&local_218,(Box *)&local_328);
          amrex::BoxArray::maxSize(&local_218,0x20);
          amrex::DistributionMapping::DistributionMapping
                    (&local_228,&local_218,*(int *)(amrex::ParallelContext::frames + 0x10));
          local_308._0_8_ =
               (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_308._8_8_ = (FabArrayBase *)0x0;
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3c8.p = (double *)&PTR__FabFactory_008378d0;
          amrex::MultiFab::MultiFab
                    ((MultiFab *)&local_1b0,&local_218,&local_228,1,0,(MFInfo *)local_308,
                     (FabFactory<amrex::FArrayBox> *)&local_3c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2f8);
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (&local_1b0,0.0,0,local_1b0.super_FabArrayBase.n_comp,
                     &local_1b0.super_FabArrayBase.n_grow);
          uVar12 = local_348;
          local_338 = local_350[local_348].super_BaseFab<double>.dptr;
          iVar21 = local_350[local_348].super_BaseFab<double>.domain.smallend.vect[0];
          iVar22 = local_350[local_348].super_BaseFab<double>.domain.smallend.vect[1];
          local_330 = (long)local_350[local_348].super_BaseFab<double>.domain.smallend.vect[2];
          iVar17 = local_350[local_348].super_BaseFab<double>.domain.bigend.vect[0];
          iVar2 = local_350[local_348].super_BaseFab<double>.domain.bigend.vect[1];
          amrex::MFIter::MFIter((MFIter *)local_308,&local_1b0.super_FabArrayBase,'\0');
          if ((int)local_2f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage < local_2e0) {
            local_260 = &local_350[uVar12].super_BaseFab<double>.domain;
            local_250 = (long)((iVar17 - iVar21) + 1);
            local_338 = local_338 + -(long)iVar21;
            local_268 = (long)iVar22 * -8;
            local_258 = (long)((iVar2 - iVar22) + 1) << 3;
            local_330 = -local_330;
            local_230 = local_340 * local_250;
            do {
              ppuVar8 = *(undefined ***)(local_260->smallend).vect;
              lVar11 = *(long *)((local_260->smallend).vect + 2);
              lVar24 = *(long *)(local_260->bigend).vect;
              uVar4 = *(undefined8 *)((local_260->bigend).vect + 2);
              local_3c8.kstride._0_4_ = (uint)((ulong)lVar24 >> 0x20);
              local_3c8.kstride._4_4_ = (uint)uVar4;
              local_3c8.nstride._0_4_ = (uint)((ulong)uVar4 >> 0x20);
              local_3c8.jstride._0_4_ = (uint)lVar11;
              local_3c8.jstride._4_4_ = (uint)((ulong)lVar11 >> 0x20);
              local_3c8.p = (double *)ppuVar8;
              if (iVar16 != 1 || (uVar20 != 1 || local_3dc != 1)) {
                local_3c8.p._0_4_ = (uint)ppuVar8;
                if (local_3dc != 1) {
                  if (local_3dc == 4) {
                    if ((int)(uint)local_3c8.p < 0) {
                      local_3c8.p._0_4_ = (uint)local_3c8.p + 1;
                      uVar10 = -(uint)local_3c8.p;
                      if (0 < (int)(uint)local_3c8.p) {
                        uVar10 = (uint)local_3c8.p;
                      }
                      uVar10 = uVar10 >> 2;
LAB_0036beb8:
                      local_3c8.p._0_4_ = ~uVar10;
                    }
                    else {
                      local_3c8.p._0_4_ = (uint)local_3c8.p >> 2;
                    }
                  }
                  else if (local_3dc == 2) {
                    if ((int)(uint)local_3c8.p < 0) {
                      local_3c8.p._0_4_ = (uint)local_3c8.p + 1;
                      uVar10 = -(uint)local_3c8.p;
                      if (0 < (int)(uint)local_3c8.p) {
                        uVar10 = (uint)local_3c8.p;
                      }
                      uVar10 = uVar10 >> 1;
                      goto LAB_0036beb8;
                    }
                    local_3c8.p._0_4_ = (uint)local_3c8.p >> 1;
                  }
                  else if ((int)(uint)local_3c8.p < 0) {
                    iVar22 = (uint)local_3c8.p + 1;
                    iVar21 = -iVar22;
                    if (0 < iVar22) {
                      iVar21 = iVar22;
                    }
                    local_3c8.p._0_4_ = ~(iVar21 / local_3dc);
                  }
                  else {
                    local_3c8.p._0_4_ = (int)(uint)local_3c8.p / local_3dc;
                  }
                }
                local_3c8.p._4_4_ = (uint)((ulong)ppuVar8 >> 0x20);
                iVar21 = (int)local_380;
                if (iVar21 != 1) {
                  if (iVar21 == 4) {
                    if ((long)ppuVar8 < 0) {
                      local_3c8.p._4_4_ = local_3c8.p._4_4_ + 1;
                      uVar10 = -local_3c8.p._4_4_;
                      if (0 < (int)local_3c8.p._4_4_) {
                        uVar10 = local_3c8.p._4_4_;
                      }
                      uVar10 = uVar10 >> 2;
LAB_0036bf1d:
                      local_3c8.p._4_4_ = ~uVar10;
                    }
                    else {
                      local_3c8.p._4_4_ = local_3c8.p._4_4_ >> 2;
                    }
                  }
                  else if (iVar21 == 2) {
                    if ((long)ppuVar8 < 0) {
                      local_3c8.p._4_4_ = local_3c8.p._4_4_ + 1;
                      uVar10 = -local_3c8.p._4_4_;
                      if (0 < (int)local_3c8.p._4_4_) {
                        uVar10 = local_3c8.p._4_4_;
                      }
                      uVar10 = uVar10 >> 1;
                      goto LAB_0036bf1d;
                    }
                    local_3c8.p._4_4_ = local_3c8.p._4_4_ >> 1;
                  }
                  else if ((long)ppuVar8 < 0) {
                    iVar17 = local_3c8.p._4_4_ + 1;
                    iVar22 = -iVar17;
                    if (0 < iVar17) {
                      iVar22 = iVar17;
                    }
                    local_3c8.p._4_4_ = ~(iVar22 / iVar21);
                  }
                  else {
                    local_3c8.p._4_4_ = (int)local_3c8.p._4_4_ / iVar21;
                  }
                }
                if (iVar16 != 1) {
                  if (iVar16 == 4) {
                    if ((int)(uint)local_3c8.jstride < 0) {
                      local_3c8.jstride._0_4_ = (uint)local_3c8.jstride + 1;
                      uVar10 = -(uint)local_3c8.jstride;
                      if (0 < (int)(uint)local_3c8.jstride) {
                        uVar10 = (uint)local_3c8.jstride;
                      }
                      uVar10 = uVar10 >> 2;
LAB_0036bf82:
                      local_3c8.jstride._0_4_ = ~uVar10;
                    }
                    else {
                      local_3c8.jstride._0_4_ = (uint)local_3c8.jstride >> 2;
                    }
                  }
                  else if (iVar16 == 2) {
                    if ((int)(uint)local_3c8.jstride < 0) {
                      local_3c8.jstride._0_4_ = (uint)local_3c8.jstride + 1;
                      uVar10 = -(uint)local_3c8.jstride;
                      if (0 < (int)(uint)local_3c8.jstride) {
                        uVar10 = (uint)local_3c8.jstride;
                      }
                      uVar10 = uVar10 >> 1;
                      goto LAB_0036bf82;
                    }
                    local_3c8.jstride._0_4_ = (uint)local_3c8.jstride >> 1;
                  }
                  else if ((int)(uint)local_3c8.jstride < 0) {
                    iVar17 = (uint)local_3c8.jstride + 1;
                    iVar22 = -iVar17;
                    if (0 < iVar17) {
                      iVar22 = iVar17;
                    }
                    local_3c8.jstride._0_4_ = ~(iVar22 / iVar16);
                  }
                  else {
                    local_3c8.jstride._0_4_ = (int)(uint)local_3c8.jstride / iVar16;
                  }
                }
                if ((uint)local_3c8.nstride == 0) {
                  if (local_3dc != 1) {
                    if (local_3dc == 4) {
                      if (lVar11 < 0) {
                        local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ + 1;
                        uVar10 = -local_3c8.jstride._4_4_;
                        if (0 < (int)local_3c8.jstride._4_4_) {
                          uVar10 = local_3c8.jstride._4_4_;
                        }
                        uVar10 = uVar10 >> 2;
LAB_0036c3e3:
                        local_3c8.jstride._4_4_ = ~uVar10;
                      }
                      else {
                        local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ >> 2;
                      }
                    }
                    else if (local_3dc == 2) {
                      if (lVar11 < 0) {
                        local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ + 1;
                        uVar10 = -local_3c8.jstride._4_4_;
                        if (0 < (int)local_3c8.jstride._4_4_) {
                          uVar10 = local_3c8.jstride._4_4_;
                        }
                        uVar10 = uVar10 >> 1;
                        goto LAB_0036c3e3;
                      }
                      local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ >> 1;
                    }
                    else if (lVar11 < 0) {
                      iVar17 = local_3c8.jstride._4_4_ + 1;
                      iVar22 = -iVar17;
                      if (0 < iVar17) {
                        iVar22 = iVar17;
                      }
                      local_3c8.jstride._4_4_ = ~(iVar22 / local_3dc);
                    }
                    else {
                      local_3c8.jstride._4_4_ = (int)local_3c8.jstride._4_4_ / local_3dc;
                    }
                  }
                  if (iVar21 != 1) {
                    if (iVar21 == 4) {
                      if (lVar24 < 0) {
                        local_3c8.kstride._0_4_ = (uint)local_3c8.kstride + 1;
                        uVar10 = -(uint)local_3c8.kstride;
                        if (0 < (int)(uint)local_3c8.kstride) {
                          uVar10 = (uint)local_3c8.kstride;
                        }
                        uVar10 = uVar10 >> 2;
LAB_0036c448:
                        local_3c8.kstride._0_4_ = ~uVar10;
                      }
                      else {
                        local_3c8.kstride._0_4_ = (uint)local_3c8.kstride >> 2;
                      }
                    }
                    else if (iVar21 == 2) {
                      if (lVar24 < 0) {
                        local_3c8.kstride._0_4_ = (uint)local_3c8.kstride + 1;
                        uVar10 = -(uint)local_3c8.kstride;
                        if (0 < (int)(uint)local_3c8.kstride) {
                          uVar10 = (uint)local_3c8.kstride;
                        }
                        uVar10 = uVar10 >> 1;
                        goto LAB_0036c448;
                      }
                      local_3c8.kstride._0_4_ = (uint)local_3c8.kstride >> 1;
                    }
                    else if (lVar24 < 0) {
                      iVar17 = (uint)local_3c8.kstride + 1;
                      iVar22 = -iVar17;
                      if (0 < iVar17) {
                        iVar22 = iVar17;
                      }
                      local_3c8.kstride._0_4_ = ~(iVar22 / iVar21);
                    }
                    else {
                      local_3c8.kstride._0_4_ = (int)(uint)local_3c8.kstride / iVar21;
                    }
                  }
                  if (iVar16 != 1) {
                    if (iVar16 == 4) {
                      if ((int)local_3c8.kstride._4_4_ < 0) {
                        local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ + 1;
                        uVar10 = -local_3c8.kstride._4_4_;
                        if (0 < (int)local_3c8.kstride._4_4_) {
                          uVar10 = local_3c8.kstride._4_4_;
                        }
                        uVar10 = uVar10 >> 2;
LAB_0036c4ba:
                        local_3c8.kstride._4_4_ = ~uVar10;
                      }
                      else {
                        local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ >> 2;
                      }
                    }
                    else if (iVar16 == 2) {
                      if ((int)local_3c8.kstride._4_4_ < 0) {
                        local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ + 1;
                        uVar10 = -local_3c8.kstride._4_4_;
                        if (0 < (int)local_3c8.kstride._4_4_) {
                          uVar10 = local_3c8.kstride._4_4_;
                        }
                        uVar10 = uVar10 >> 1;
                        goto LAB_0036c4ba;
                      }
                      local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ >> 1;
                    }
                    else if ((int)local_3c8.kstride._4_4_ < 0) {
                      iVar22 = local_3c8.kstride._4_4_ + 1;
                      iVar21 = -iVar22;
                      if (0 < iVar22) {
                        iVar21 = iVar22;
                      }
                      local_3c8.kstride._4_4_ = ~(iVar21 / iVar16);
                    }
                    else {
                      local_3c8.kstride._4_4_ = (int)local_3c8.kstride._4_4_ / iVar16;
                    }
                  }
                }
                else {
                  local_36c.smallend.vect[0] = 0;
                  local_36c.smallend.vect[1] = 0;
                  local_36c.smallend.vect[2] = 0;
                  lVar18 = 0;
                  do {
                    if ((((uint)local_3c8.nstride >> ((uint)lVar18 & 0x1f) & 1) != 0) &&
                       (*(int *)((long)&local_3c8.jstride + lVar18 * 4 + 4) % local_3d8[lVar18] != 0
                       )) {
                      local_36c.smallend.vect[lVar18] = 1;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  if (local_3dc != 1) {
                    if (local_3dc == 4) {
                      if (lVar11 < 0) {
                        local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ + 1;
                        uVar10 = -local_3c8.jstride._4_4_;
                        if (0 < (int)local_3c8.jstride._4_4_) {
                          uVar10 = local_3c8.jstride._4_4_;
                        }
                        uVar10 = uVar10 >> 2;
LAB_0036c081:
                        local_3c8.jstride._4_4_ = ~uVar10;
                      }
                      else {
                        local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ >> 2;
                      }
                    }
                    else if (local_3dc == 2) {
                      if (lVar11 < 0) {
                        local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ + 1;
                        uVar10 = -local_3c8.jstride._4_4_;
                        if (0 < (int)local_3c8.jstride._4_4_) {
                          uVar10 = local_3c8.jstride._4_4_;
                        }
                        uVar10 = uVar10 >> 1;
                        goto LAB_0036c081;
                      }
                      local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ >> 1;
                    }
                    else if (lVar11 < 0) {
                      iVar17 = local_3c8.jstride._4_4_ + 1;
                      iVar22 = -iVar17;
                      if (0 < iVar17) {
                        iVar22 = iVar17;
                      }
                      local_3c8.jstride._4_4_ = ~(iVar22 / local_3dc);
                    }
                    else {
                      local_3c8.jstride._4_4_ = (int)local_3c8.jstride._4_4_ / local_3dc;
                    }
                  }
                  if (iVar21 != 1) {
                    if (iVar21 == 4) {
                      if (lVar24 < 0) {
                        local_3c8.kstride._0_4_ = (uint)local_3c8.kstride + 1;
                        uVar10 = -(uint)local_3c8.kstride;
                        if (0 < (int)(uint)local_3c8.kstride) {
                          uVar10 = (uint)local_3c8.kstride;
                        }
                        uVar10 = uVar10 >> 2;
LAB_0036c0e8:
                        local_3c8.kstride._0_4_ = ~uVar10;
                      }
                      else {
                        local_3c8.kstride._0_4_ = (uint)local_3c8.kstride >> 2;
                      }
                    }
                    else if (iVar21 == 2) {
                      if (lVar24 < 0) {
                        local_3c8.kstride._0_4_ = (uint)local_3c8.kstride + 1;
                        uVar10 = -(uint)local_3c8.kstride;
                        if (0 < (int)(uint)local_3c8.kstride) {
                          uVar10 = (uint)local_3c8.kstride;
                        }
                        uVar10 = uVar10 >> 1;
                        goto LAB_0036c0e8;
                      }
                      local_3c8.kstride._0_4_ = (uint)local_3c8.kstride >> 1;
                    }
                    else if (lVar24 < 0) {
                      iVar17 = (uint)local_3c8.kstride + 1;
                      iVar22 = -iVar17;
                      if (0 < iVar17) {
                        iVar22 = iVar17;
                      }
                      local_3c8.kstride._0_4_ = ~(iVar22 / iVar21);
                    }
                    else {
                      local_3c8.kstride._0_4_ = (int)(uint)local_3c8.kstride / iVar21;
                    }
                  }
                  if (iVar16 != 1) {
                    if (iVar16 == 4) {
                      if ((int)local_3c8.kstride._4_4_ < 0) {
                        local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ + 1;
                        uVar10 = -local_3c8.kstride._4_4_;
                        if (0 < (int)local_3c8.kstride._4_4_) {
                          uVar10 = local_3c8.kstride._4_4_;
                        }
                        uVar10 = uVar10 >> 2;
LAB_0036c14d:
                        local_3c8.kstride._4_4_ = ~uVar10;
                      }
                      else {
                        local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ >> 2;
                      }
                    }
                    else if (iVar16 == 2) {
                      if ((int)local_3c8.kstride._4_4_ < 0) {
                        local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ + 1;
                        uVar10 = -local_3c8.kstride._4_4_;
                        if (0 < (int)local_3c8.kstride._4_4_) {
                          uVar10 = local_3c8.kstride._4_4_;
                        }
                        uVar10 = uVar10 >> 1;
                        goto LAB_0036c14d;
                      }
                      local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ >> 1;
                    }
                    else if ((int)local_3c8.kstride._4_4_ < 0) {
                      iVar22 = local_3c8.kstride._4_4_ + 1;
                      iVar21 = -iVar22;
                      if (0 < iVar22) {
                        iVar21 = iVar22;
                      }
                      local_3c8.kstride._4_4_ = ~(iVar21 / iVar16);
                    }
                    else {
                      local_3c8.kstride._4_4_ = (int)local_3c8.kstride._4_4_ / iVar16;
                    }
                  }
                  local_3c8.jstride._4_4_ = local_3c8.jstride._4_4_ + local_36c.smallend.vect[0];
                  local_3c8.kstride._0_4_ = (uint)local_3c8.kstride + local_36c.smallend.vect[1];
                  local_3c8.kstride._4_4_ = local_3c8.kstride._4_4_ + local_36c.smallend.vect[2];
                }
              }
              amrex::BATransformer::operator()
                        (&local_36c,(BATransformer *)(local_308._8_8_ + 8),
                         (Box *)((long)(local_2d0->super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start
                                       [(int)local_2f8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage] *
                                 0x1c + *(long *)&(((((BoxArray *)(local_308._8_8_ + 8))->m_ref).
                                                                                                        
                                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->m_abox).
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data));
              iVar21 = local_36c.smallend.vect[0];
              if (local_36c.smallend.vect[0] < (int)(uint)local_3c8.p) {
                iVar21 = (uint)local_3c8.p;
              }
              iVar22 = local_36c.smallend.vect[1];
              if (local_36c.smallend.vect[1] < (int)local_3c8.p._4_4_) {
                iVar22 = local_3c8.p._4_4_;
              }
              uVar10 = local_36c.smallend.vect[2];
              if (local_36c.smallend.vect[2] < (int)(uint)local_3c8.jstride) {
                uVar10 = (uint)local_3c8.jstride;
              }
              uVar6 = local_36c.bigend.vect[0];
              if ((int)local_3c8.jstride._4_4_ < local_36c.bigend.vect[0]) {
                uVar6 = local_3c8.jstride._4_4_;
              }
              uVar7 = local_36c.bigend.vect[1];
              if ((int)(uint)local_3c8.kstride < local_36c.bigend.vect[1]) {
                uVar7 = (uint)local_3c8.kstride;
              }
              local_3d8[3] = local_36c.bigend.vect[2];
              if ((int)local_3c8.kstride._4_4_ < local_36c.bigend.vect[2]) {
                local_3d8[3] = local_3c8.kstride._4_4_;
              }
              if ((((iVar21 <= (int)uVar6) && (iVar22 <= (int)uVar7)) &&
                  ((int)uVar10 <= local_3d8[3])) && ((uint)local_3c8.nstride < 8)) {
                local_378 = CONCAT44(local_378._4_4_,iVar22);
                amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                          (&local_3c8,&local_1b0,(MFIter *)local_308);
                lVar24 = (long)(int)local_378;
                lVar11 = CONCAT44(local_3c8.jstride._4_4_,(uint)local_3c8.jstride) * 8;
                local_248 = (lVar24 - local_3c8.begin.y) * lVar11 + (long)iVar21 * 8 +
                            (long)local_3c8.begin.x * -8 + (long)local_3c8.p;
                local_378 = CONCAT44(local_3c8.kstride._4_4_,(uint)local_3c8.kstride) * 8;
                local_238 = -(long)local_3c8.begin.z;
                local_240 = (double *)((long)iVar21 * (long)local_3dc * 8 + (long)local_338);
                iVar22 = iVar16 * uVar10;
                do {
                  lVar23 = ((int)uVar10 + local_238) * local_378 + local_248;
                  pdVar15 = (double *)
                            (((iVar22 + local_330) * local_258 + local_340 * lVar24 + local_268) *
                             local_250 + (long)local_240);
                  lVar18 = lVar24;
                  do {
                    if (iVar21 <= (int)uVar6) {
                      lVar19 = 0;
                      pdVar13 = pdVar15;
                      do {
                        *(double *)(lVar23 + lVar19 * 8) = *pdVar13;
                        lVar19 = lVar19 + 1;
                        pdVar13 = pdVar13 + local_3dc;
                      } while ((uVar6 - iVar21) + 1 != (int)lVar19);
                    }
                    lVar18 = lVar18 + 1;
                    lVar23 = lVar23 + lVar11;
                    pdVar15 = (double *)((long)pdVar15 + local_230);
                  } while (uVar7 + 1 != (int)lVar18);
                  iVar22 = iVar22 + iVar16;
                  bVar25 = uVar10 != local_3d8[3];
                  uVar10 = uVar10 + 1;
                } while (bVar25);
              }
              amrex::MFIter::operator++((MFIter *)local_308);
            } while ((int)local_2f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage < local_2e0);
          }
          amrex::MFIter::~MFIter((MFIter *)local_308);
          lVar24 = local_278;
          this_00 = &(local_290->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                     ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_278]->
                     super_FabArray<amrex::FArrayBox>;
          period = amrex::Periodicity::NonPeriodic();
          amrex::FabArray<amrex::FArrayBox>::ParallelCopy(this_00,&local_1b0,period,COPY);
          amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
          if (local_228.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_228.m_ref.
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          amrex::BoxArray::~BoxArray(&local_218);
          local_348 = local_348 + 1;
        } while (local_348 != (uint)numOutFlowFaces);
      }
      lVar11 = lVar24;
    } while (local_2a0 < lVar24);
  }
  return;
}

Assistant:

void
Projection::putDown (const Vector<MultiFab*>& phi,
                     FArrayBox*         phi_fine_strip,
                     int                c_lev,
                     int                f_lev,
                     const Orientation* outFaces,
                     int                numOutFlowFaces,
                     int                ncStripWidth)
{
    BL_PROFILE("Projection::putDown()");
    //
    // Put down to coarser levels.
    //
    const int nCompPhi = 1; // phi_fine_strip.nComp();
    const int nGrow    = 0; // phi_fine_strip.nGrow();
    IntVect ratio      = IntVect::TheUnitVector();

    for (int lev = f_lev-1; lev >= c_lev; lev--)
    {
        ratio *= parent->refRatio(lev);
        const Box& domainC = parent->Geom(lev).Domain();

        for (int iface = 0; iface < numOutFlowFaces; iface++)
        {
            Box phiC_strip =
                amrex::surroundingNodes(amrex::bdryNode(domainC, outFaces[iface], ncStripWidth));
            phiC_strip.grow(nGrow);
            BoxArray ba(phiC_strip);

            // FIXME: this size may need adjusting
            ba.maxSize(32);

            DistributionMapping dm{ba};
            MultiFab phi_crse_strip(ba, dm, nCompPhi, 0);
            phi_crse_strip.setVal(0);
            const auto& phi_f_arr = phi_fine_strip[iface].array();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(phi_crse_strip); mfi.isValid(); ++mfi)
            {
                Box ovlp = amrex::coarsen(phi_fine_strip[iface].box(),ratio) & mfi.validbox();
                if (ovlp.ok())
                {
                    const auto& phi_c_arr = phi_crse_strip.array(mfi);
                    ParallelFor(ovlp, [phi_c_arr,phi_f_arr,ratio]
                    AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                    {
                       phi_c_arr(i,j,k) = phi_f_arr(i*ratio[0],j*ratio[1],k*ratio[2]);
                    });
                }
            }
            phi[lev]->ParallelCopy(phi_crse_strip);
        }
    }
}